

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O3

void __thiscall pktalloc::Allocator::Allocator(Allocator *this)

{
  bool bVar1;
  WindowHeader *window;
  void *pvVar2;
  WindowHeader *pWVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  
  this->HugeChunkStart = (uint8_t *)0x0;
  (this->PreferredWindows).Size = 0;
  (this->PreferredWindows).Allocated = 0x19;
  (this->PreferredWindows).DataPtr = (this->PreferredWindows).PreallocatedData;
  (this->FullWindows).Size = 0;
  (this->FullWindows).Allocated = 0x19;
  (this->FullWindows).DataPtr = (this->FullWindows).PreallocatedData;
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_NoCopy(&this->PreferredWindows,2);
  pvVar2 = calloc(1,0x20260);
  if (pvVar2 == (void *)0x0) {
    this->HugeChunkStart = (uint8_t *)0x0;
  }
  else {
    uVar5 = (uint)pvVar2 & 0x1f;
    lVar6 = 0;
    *(char *)((long)pvVar2 + (0x1f - (ulong)uVar5)) = (char)uVar5;
    pWVar3 = (WindowHeader *)((long)pvVar2 + (0x20 - (ulong)uVar5));
    this->HugeChunkStart = (uint8_t *)pWVar3;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      *(undefined8 *)&pWVar3->field_0xc0 = 0;
      *(undefined8 *)&pWVar3->field_0xc8 = 0;
      *(undefined8 *)&pWVar3->field_0xd0 = 0;
      *(undefined8 *)&pWVar3->field_0xd8 = 0;
      *(undefined8 *)&pWVar3->field_0xe0 = 0;
      *(undefined8 *)&pWVar3->field_0xe8 = 0;
      *(undefined8 *)&pWVar3->field_0xf0 = 0;
      *(undefined8 *)&pWVar3->field_0xf8 = 0;
      *(undefined8 *)&pWVar3->field_0x80 = 0;
      *(undefined8 *)&pWVar3->field_0x88 = 0;
      *(undefined8 *)&pWVar3->field_0x90 = 0;
      *(undefined8 *)&pWVar3->field_0x98 = 0;
      *(undefined8 *)&pWVar3->field_0xa0 = 0;
      *(undefined8 *)&pWVar3->field_0xa8 = 0;
      *(undefined8 *)&pWVar3->field_0xb0 = 0;
      *(undefined8 *)&pWVar3->field_0xb8 = 0;
      *(undefined8 *)&pWVar3->field_0x40 = 0;
      *(undefined8 *)&pWVar3->field_0x48 = 0;
      *(undefined8 *)&pWVar3->field_0x50 = 0;
      *(undefined8 *)&pWVar3->field_0x58 = 0;
      *(undefined8 *)&pWVar3->field_0x60 = 0;
      *(undefined8 *)&pWVar3->field_0x68 = 0;
      *(undefined8 *)&pWVar3->field_0x70 = 0;
      *(undefined8 *)&pWVar3->field_0x78 = 0;
      *(undefined8 *)pWVar3 = 0;
      *(undefined8 *)&pWVar3->field_0x8 = 0;
      *(undefined8 *)&pWVar3->field_0x10 = 0;
      *(undefined8 *)&pWVar3->field_0x18 = 0;
      *(undefined8 *)&pWVar3->field_0x20 = 0;
      *(undefined8 *)&pWVar3->field_0x28 = 0;
      *(undefined8 *)&pWVar3->field_0x30 = 0;
      *(undefined8 *)&pWVar3->field_0x38 = 0;
      pWVar3->FreeUnitCount = 0x800;
      pWVar3->ResumeScanOffset = 0;
      pWVar3->Preallocated = true;
      pWVar3->FullListIndex = -1;
      (this->PreferredWindows).DataPtr[lVar6] = pWVar3;
      pWVar3 = pWVar3 + 0xf2;
      lVar6 = 1;
      bVar1 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

Allocator::Allocator()
{
    static_assert(kAlignmentBytes == kUnitSize, "update SIMDSafeAllocate");

    PreferredWindows.SetSize_NoCopy(kPreallocatedWindows);

    HugeChunkStart = SIMDSafeAllocate(kWindowSizeBytes * kPreallocatedWindows);
    if (HugeChunkStart)
    {
        uint8_t* windowStart = HugeChunkStart;

        // For each window to preallocate:
        for (unsigned i = 0; i < kPreallocatedWindows; ++i)
        {
            WindowHeader* window = (WindowHeader*)windowStart;
            windowStart += kWindowSizeBytes;

            window->Used.ClearAll();
            window->FreeUnitCount = kWindowMaxUnits;
            window->ResumeScanOffset = 0;
            window->Preallocated = true;
            window->FullListIndex = kNotInFullList;

            PreferredWindows.GetRef(i) = window;
        }
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();
}